

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

int __thiscall Problem::getStateConflicts(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int local_60;
  int j;
  int curRegionsSize;
  int *curRegions;
  int curBidNumber;
  int i;
  int totalConflicts;
  allocator<int> local_35;
  value_type local_34;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> conflictArray;
  vector<int,_std::allocator<int>_> *bidNos_local;
  Problem *this_local;
  
  iVar1 = this->numRegions;
  local_34 = 0;
  conflictArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bidNos;
  std::allocator<int>::allocator(&local_35);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,(long)iVar1,&local_34,&local_35);
  std::allocator<int>::~allocator(&local_35);
  curBidNumber = 0;
  for (curRegions._4_4_ = 0; curRegions._4_4_ < this->numCompanies;
      curRegions._4_4_ = curRegions._4_4_ + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](bidNos,(long)curRegions._4_4_);
    iVar1 = *pvVar2;
    pvVar3 = std::vector<node,_std::allocator<node>_>::operator[]
                       (this->problemData + curRegions._4_4_,(long)iVar1);
    pvVar4 = std::vector<node,_std::allocator<node>_>::operator[]
                       (this->problemData + curRegions._4_4_,(long)iVar1);
    iVar1 = pvVar4->norc;
    for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,
                          (long)pvVar3->region[local_60]);
      if (*pvVar2 == 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,
                            (long)pvVar3->region[local_60]);
        *pvVar2 = 1;
      }
      else {
        curBidNumber = curBidNumber + 1;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return curBidNumber;
}

Assistant:

int Problem::getStateConflicts(vector<int> bidNos) {
    vector<int> conflictArray(this->numRegions, 0);
    int totalConflicts = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        // cout<<"Current bid no.: "<<curBidNumber<<endl;
        int *curRegions = this->problemData[i][curBidNumber].region;
        int curRegionsSize = this->problemData[i][curBidNumber].norc;
        // cout<<"Region size: "<<curRegionsSize<<endl;
        for (int j = 0; j < curRegionsSize; j++) {
            if (conflictArray[curRegions[j]] != 0) {
                totalConflicts++;
            }
            else {
                conflictArray[curRegions[j]] = 1;
            }
        }
    }
    // cout<<"Conflicts found: "<<totalConflicts<<endl;
    return totalConflicts;
}